

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

LocalScopeInfoIdToScopeInfoMap * __thiscall
Js::ByteCodeCache::EnsureLocalScopeInfoIdToScopeInfoMap
          (ByteCodeCache *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar3;
  
  if (this->localScopeInfoIdToScopeInfoMap == (LocalScopeInfoIdToScopeInfoMap *)0x0) {
    this_00 = (BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,&scriptContext->sourceCodeAllocator,0x366bee);
    JsUtil::
    BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,&scriptContext->sourceCodeAllocator,10);
    this->localScopeInfoIdToScopeInfoMap = this_00;
  }
  if (this->localScopeInfoIdToScopeInfoMap == (LocalScopeInfoIdToScopeInfoMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x133d,"(this->localScopeInfoIdToScopeInfoMap != nullptr)",
                                "this->localScopeInfoIdToScopeInfoMap != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->localScopeInfoIdToScopeInfoMap;
}

Assistant:

ByteCodeCache::LocalScopeInfoIdToScopeInfoMap * ByteCodeCache::EnsureLocalScopeInfoIdToScopeInfoMap(ScriptContext * scriptContext)
{
    if (this->localScopeInfoIdToScopeInfoMap == nullptr)
    {
        this->localScopeInfoIdToScopeInfoMap = Anew(scriptContext->SourceCodeAllocator(), LocalScopeInfoIdToScopeInfoMap, scriptContext->SourceCodeAllocator(), 10);
    }
    Assert(this->localScopeInfoIdToScopeInfoMap != nullptr);
    return this->localScopeInfoIdToScopeInfoMap;
}